

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CropResizeLayerParams::SharedDtor(CropResizeLayerParams *this)

{
  SamplingMode *this_00;
  BoxCoordinatesMode *this_01;
  Arena *pAVar1;
  LogMessage *other;
  CropResizeLayerParams *pCVar2;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  CropResizeLayerParams *local_10;
  CropResizeLayerParams *this_local;
  
  local_10 = this;
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar1 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x76ac);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pCVar2 = internal_default_instance();
  if ((this != pCVar2) && (this_00 = this->mode_, this_00 != (SamplingMode *)0x0)) {
    SamplingMode::~SamplingMode(this_00);
    operator_delete(this_00,0x18);
  }
  pCVar2 = internal_default_instance();
  if ((this != pCVar2) && (this_01 = this->boxindicesmode_, this_01 != (BoxCoordinatesMode *)0x0)) {
    BoxCoordinatesMode::~BoxCoordinatesMode(this_01);
    operator_delete(this_01,0x18);
  }
  return;
}

Assistant:

inline void CropResizeLayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete mode_;
  if (this != internal_default_instance()) delete boxindicesmode_;
}